

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O3

void slang::mul(uint64_t *dst,uint64_t *x,uint32_t xlen,uint64_t *y,uint32_t ylen)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint ylen_00;
  uint uVar10;
  uint64_t *dst_00;
  uint64_t *puVar11;
  uint64_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t uVar15;
  uint ylen_01;
  uint32_t xlen_00;
  uint uVar16;
  uint64_t uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  TempBuffer<unsigned_long,_128UL> t1;
  TempBuffer<unsigned_long,_128UL> t2;
  uint64_t local_c50 [128];
  uint64_t *local_850;
  ulong local_848;
  uint64_t local_840 [128];
  uint64_t *local_440;
  ulong local_438;
  uint64_t local_430 [128];
  ulong uVar17;
  
  uVar14 = (ulong)xlen;
  if (ylen < 8 || xlen < 8) {
    if (xlen == 0) {
      uVar14 = 0;
      uVar18 = 0;
    }
    else {
      uVar19 = *y;
      uVar20 = 0;
      uVar18 = 0;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar18;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar19;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = x[uVar20];
        auVar8 = auVar4 * auVar6 + auVar8;
        uVar18 = auVar8._8_8_;
        dst[uVar20] = auVar8._0_8_;
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
    }
    dst[uVar14] = uVar18;
    if (1 < ylen) {
      uVar19 = 1;
      do {
        if (xlen == 0) {
          uVar18 = 0;
        }
        else {
          uVar20 = 0;
          uVar18 = 0;
          do {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar18;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = y[uVar19];
            auVar7._8_8_ = 0;
            auVar7._0_8_ = x[uVar20];
            auVar9 = auVar5 * auVar7 + auVar9;
            uVar13 = auVar9._0_8_;
            puVar1 = dst + (uint)((int)uVar19 + (int)uVar20);
            uVar17 = *puVar1;
            *puVar1 = *puVar1 + uVar13;
            uVar18 = auVar9._8_8_ + (ulong)CARRY8(uVar17,uVar13);
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
        }
        dst[(int)uVar19 + xlen] = uVar18;
        uVar19 = uVar19 + 1;
      } while (uVar19 != ylen);
    }
  }
  else {
    puVar12 = x;
    uVar15 = ylen;
    if (xlen <= ylen) {
      uVar14 = (ulong)ylen;
      puVar12 = y;
      y = x;
      uVar15 = xlen;
    }
    uVar19 = uVar14 >> 1;
    ylen_00 = (uint)uVar19;
    uVar20 = (ulong)uVar15;
    if (ylen_00 < uVar15) {
      uVar20 = uVar19;
    }
    xlen_00 = (uint32_t)uVar20;
    uVar15 = uVar15 - xlen_00;
    ylen_01 = (uint)uVar14 - ylen_00;
    uVar16 = ylen + xlen;
    uVar17 = (ulong)uVar16;
    if (uVar16 < 0x81) {
      dst_00 = local_c50;
    }
    else {
      dst_00 = (uint64_t *)operator_new__(uVar17 * 8);
    }
    uVar13 = uVar17 * 8;
    memset(dst_00,0,uVar13);
    mul(dst_00,y + uVar20,uVar15,puVar12 + uVar19,ylen_01);
    memset(dst,0,uVar13);
    memcpy(dst + ((uint)uVar14 & 0xfffffffe),dst_00,(ulong)(uVar15 + ylen_01) << 3);
    local_848 = uVar17;
    if (uVar16 < 0x81) {
      puVar11 = local_840;
    }
    else {
      puVar11 = (uint64_t *)operator_new__(uVar13);
    }
    local_850 = puVar11;
    memset(puVar11,0,uVar13);
    mul(puVar11,y,xlen_00,puVar12,ylen_00);
    puVar11 = local_850;
    memcpy(dst,local_850,(ulong)(xlen_00 + ylen_00) << 3);
    uVar10 = uVar16 - ylen_00;
    if (uVar10 != 0) {
      uVar14 = 0;
      bVar21 = false;
      do {
        puVar1 = dst + uVar19 + uVar14;
        uVar2 = (ulong)bVar21;
        uVar3 = *puVar1 - puVar11[uVar14];
        bVar21 = *puVar1 < puVar11[uVar14] || uVar3 < uVar2;
        *puVar1 = uVar3 - uVar2;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
      uVar14 = 0;
      bVar21 = false;
      do {
        puVar1 = dst + uVar19 + uVar14;
        uVar2 = (ulong)bVar21;
        uVar3 = *puVar1 - dst_00[uVar14];
        bVar21 = *puVar1 < dst_00[uVar14] || uVar3 < uVar2;
        *puVar1 = uVar3 - uVar2;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
    memset(dst_00,0,uVar17 << 3);
    unevenAdd(dst_00,y + uVar20,uVar15,y,xlen_00);
    memset(local_850,0,local_848 << 3);
    unevenAdd(local_850,puVar12 + uVar19,ylen_01,puVar12,ylen_00);
    if (uVar15 < xlen_00) {
      uVar15 = xlen_00;
    }
    if (ylen_01 < ylen_00) {
      ylen_01 = ylen_00;
    }
    if (uVar16 <= ylen_01 + uVar15 + 2) {
      assert::assertFailed
                ("std::max(xlSize, xhSize) + 1 + std::max(ylSize, yhSize) + 1 < xlen + ylen",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVIntHelpers.h"
                 ,0x174,
                 "void slang::mulKaratsuba(uint64_t *, const uint64_t *, uint32_t, const uint64_t *, uint32_t)"
                );
    }
    local_438 = uVar17;
    if (uVar16 < 0x81) {
      puVar12 = local_430;
    }
    else {
      puVar12 = (uint64_t *)operator_new__(uVar13);
    }
    local_440 = puVar12;
    memset(puVar12,0,uVar13);
    mul(puVar12,dst_00,uVar15 + 1,local_850,ylen_01 + 1);
    if (uVar16 != ylen_00) {
      uVar14 = 0;
      bVar21 = false;
      do {
        puVar1 = dst + uVar19 + uVar14;
        uVar20 = (ulong)bVar21;
        uVar13 = *puVar1 + local_440[uVar14];
        bVar21 = CARRY8(*puVar1,local_440[uVar14]) || CARRY8(uVar13,uVar20);
        *puVar1 = uVar13 + uVar20;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
    if (local_440 != (uint64_t *)0x0 && 0x80 < local_438) {
      operator_delete__(local_440);
    }
    if ((0x80 < local_848) && (local_850 != (uint64_t *)0x0)) {
      operator_delete__(local_850);
    }
    if ((0x80 < uVar17) && (dst_00 != (uint64_t *)0x0)) {
      operator_delete__(dst_00);
    }
  }
  return;
}

Assistant:

static void mul(uint64_t* dst, const uint64_t* x, uint32_t xlen, const uint64_t* y, uint32_t ylen) {
    if (xlen > 7 && ylen > 7) {
        mulKaratsuba(dst, x, xlen, y, ylen);
        return;
    }

    dst[xlen] = mulOne(dst, x, xlen, y[0]);
    for (uint32_t i = 1; i < ylen; i++) {
        uint64_t carry = 0;
        for (uint32_t j = 0; j < xlen; j++) {
            calc_out_t result;
            uint8_t c = addcarry64(0, mulTerm(x[j], y[i], carry), dst[i + j], &result);

            dst[i + j] = result;
            carry += c;
        }
        dst[i + xlen] = carry;
    }
}